

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O1

void EOPLL_SetChipMode(EOPLL *opll,UINT8 Mode)

{
  undefined7 in_register_00000031;
  uint8_t (*dump) [152];
  
  opll->vrc7_mode = Mode;
  dump = default_inst + 1;
  if ((int)CONCAT71(in_register_00000031,Mode) == 0) {
    dump = default_inst;
  }
  EOPLL_setPatch(opll,*dump);
  return;
}

Assistant:

void EOPLL_SetChipMode(EOPLL* opll, UINT8 Mode)
{
  // Enable/Disable VRC7 Mode (with only 6 instead of 9 channels and no rhythm part)
  opll->vrc7_mode = Mode;
  if (opll->vrc7_mode)
    EOPLL_setPatch(opll, default_inst[EOPLL_VRC7_TONE]);
  else
    EOPLL_setPatch(opll, default_inst[EOPLL_2413_TONE]);
  
  return;
}